

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Liby::Buffer::shrink(Buffer *this,off_t len)

{
  char *__dest;
  ulong uVar1;
  char *newBuffer;
  off_t len_local;
  Buffer *this_local;
  
  if (len < this->capacity_) {
    uVar1 = len;
    if (len < 0) {
      uVar1 = 0xffffffffffffffff;
    }
    __dest = (char *)operator_new__(uVar1);
    memcpy(__dest,this->buffer_,len);
    if (this->buffer_ != (char *)0x0) {
      operator_delete__(this->buffer_);
    }
    this->buffer_ = __dest;
    this->capacity_ = len;
    this->rightIndex_ = 0;
    this->leftIndex_ = 0;
  }
  return;
}

Assistant:

void Buffer::shrink(off_t len) {
    if (len < capacity_) {
        char *newBuffer = new char[len];
        ::memcpy(newBuffer, buffer_, len);
        delete[] buffer_;
        buffer_ = newBuffer;
        capacity_ = len;
        leftIndex_ = rightIndex_ = 0;
    }
}